

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll_set.cpp
# Opt level: O0

void __thiscall miniros::PollSet::update(PollSet *this,int poll_timeout)

{
  bool bVar1;
  uint uVar2;
  pointer ppVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  pointer ppVar4;
  long in_RDI;
  int *__val;
  scoped_lock<std::mutex> lock;
  scoped_lock<std::mutex> lock_2;
  bool skip;
  SocketInfo *info;
  iterator it_1;
  scoped_lock<std::mutex> lock_1;
  int events;
  TransportPtr transport;
  SocketUpdateFunc func;
  int revents;
  int fd;
  iterator it;
  bool enabled;
  shared_ptr<std::vector<pollfd,_std::allocator<pollfd>_>_> ofds;
  char *in_stack_fffffffffffffe98;
  function<void_(int)> *in_stack_fffffffffffffea0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffeb0;
  function<void_(int)> *in_stack_fffffffffffffec0;
  void *logger_handle;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  Level LVar5;
  LogLocation *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  int in_stack_ffffffffffffff34;
  uint uVar6;
  nfds_t in_stack_ffffffffffffff38;
  SocketInfo *pSVar7;
  _Self in_stack_ffffffffffffff40;
  _Self in_stack_ffffffffffffff48;
  int epfd;
  uint local_a4;
  __normal_iterator<pollfd_*,_std::vector<pollfd,_std::allocator<pollfd>_>_> local_60;
  undefined1 local_52;
  undefined1 local_51 [49];
  __shared_ptr local_20 [32];
  
  epfd = (int)((ulong)in_stack_ffffffffffffff48._M_node >> 0x20);
  createNativePollset((PollSet *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  std::vector<pollfd,_std::allocator<pollfd>_>::front
            ((vector<pollfd,_std::allocator<pollfd>_> *)in_stack_fffffffffffffea0);
  std::vector<pollfd,_std::allocator<pollfd>_>::size
            ((vector<pollfd,_std::allocator<pollfd>_> *)(in_RDI + 0xa0));
  poll_sockets(epfd,(socket_pollfd *)in_stack_ffffffffffffff40._M_node,in_stack_ffffffffffffff38,
               in_stack_ffffffffffffff34);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_20);
  if (bVar1) {
    std::
    __shared_ptr_access<std::vector<pollfd,_std::allocator<pollfd>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<std::vector<pollfd,_std::allocator<pollfd>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4853aa);
    local_60._M_current =
         (pollfd *)
         std::vector<pollfd,_std::allocator<pollfd>_>::begin
                   ((vector<pollfd,_std::allocator<pollfd>_> *)in_stack_fffffffffffffe98);
    while( true ) {
      std::
      __shared_ptr_access<std::vector<pollfd,_std::allocator<pollfd>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<std::vector<pollfd,_std::allocator<pollfd>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x4853c7);
      std::vector<pollfd,_std::allocator<pollfd>_>::end
                ((vector<pollfd,_std::allocator<pollfd>_> *)in_stack_fffffffffffffe98);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<pollfd_*,_std::vector<pollfd,_std::allocator<pollfd>_>_>
                          *)in_stack_fffffffffffffea0,
                         (__normal_iterator<pollfd_*,_std::vector<pollfd,_std::allocator<pollfd>_>_>
                          *)in_stack_fffffffffffffe98);
      if (!bVar1) break;
      __gnu_cxx::__normal_iterator<pollfd_*,_std::vector<pollfd,_std::allocator<pollfd>_>_>::
      operator->(&local_60);
      ppVar3 = __gnu_cxx::__normal_iterator<pollfd_*,_std::vector<pollfd,_std::allocator<pollfd>_>_>
               ::operator->(&local_60);
      uVar2 = (uint)ppVar3->revents;
      std::function<void_(int)>::function(in_stack_fffffffffffffea0);
      std::shared_ptr<miniros::Transport>::shared_ptr((shared_ptr<miniros::Transport> *)0x48543d);
      local_a4 = 0;
      if (uVar2 != 0) {
        std::scoped_lock<std::mutex>::scoped_lock
                  ((scoped_lock<std::mutex> *)in_stack_fffffffffffffea0,
                   (mutex_type *)in_stack_fffffffffffffe98);
        __first._M_current =
             (int *)std::
                    map<int,_miniros::PollSet::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_miniros::PollSet::SocketInfo>_>_>
                    ::find((map<int,_miniros::PollSet::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_miniros::PollSet::SocketInfo>_>_>
                            *)in_stack_fffffffffffffe98,(key_type_conflict1 *)0x48548c);
        std::
        map<int,_miniros::PollSet::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_miniros::PollSet::SocketInfo>_>_>
        ::end((map<int,_miniros::PollSet::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_miniros::PollSet::SocketInfo>_>_>
               *)in_stack_fffffffffffffe98);
        bVar1 = std::operator==((_Self *)&stack0xffffffffffffff48,(_Self *)&stack0xffffffffffffff40)
        ;
        if (!bVar1) {
          ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_miniros::PollSet::SocketInfo>_>::
                   operator->((_Rb_tree_iterator<std::pair<const_int,_miniros::PollSet::SocketInfo>_>
                               *)0x485529);
          pSVar7 = &ppVar4->second;
          std::function<void_(int)>::operator=
                    (in_stack_fffffffffffffec0,(function<void_(int)> *)__first._M_current);
          std::shared_ptr<miniros::Transport>::operator=
                    ((shared_ptr<miniros::Transport> *)in_stack_fffffffffffffea0,
                     (shared_ptr<miniros::Transport> *)in_stack_fffffffffffffe98);
          local_a4 = pSVar7->events_;
        }
        std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x48558f);
        if (((!bVar1) &&
            (bVar1 = std::function::operator_cast_to_bool(in_stack_fffffffffffffea0), bVar1)) &&
           (((local_a4 & uVar2) != 0 ||
            ((((uVar2 & 8) != 0 || ((uVar2 & 0x10) != 0)) || ((uVar2 & 0x20) != 0)))))) {
          uVar6 = 0;
          if ((uVar2 & 0x38) != 0) {
            std::scoped_lock<std::mutex>::scoped_lock
                      ((scoped_lock<std::mutex> *)in_stack_fffffffffffffea0,
                       (mutex_type *)in_stack_fffffffffffffe98);
            __val = (int *)(in_RDI + 0x88);
            std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe98);
            std::vector<int,_std::allocator<int>_>::end
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe98);
            in_stack_fffffffffffffeb0 =
                 std::
                 find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                           (__first,in_stack_fffffffffffffeb0,__val);
            std::vector<int,_std::allocator<int>_>::end
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe98);
            bVar1 = __gnu_cxx::operator!=
                              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               in_stack_fffffffffffffea0,
                               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               in_stack_fffffffffffffe98);
            if (bVar1) {
              uVar6 = 0x1000000;
            }
            std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4856f3);
          }
          if ((uVar6 & 0x1000000) == 0) {
            std::function<void_(int)>::operator()
                      (in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
          }
        }
      }
      std::shared_ptr<miniros::Transport>::~shared_ptr((shared_ptr<miniros::Transport> *)0x48573b);
      std::function<void_(int)>::~function((function<void_(int)> *)0x485748);
      __gnu_cxx::__normal_iterator<pollfd_*,_std::vector<pollfd,_std::allocator<pollfd>_>_>::
      operator++(&local_60);
    }
  }
  else {
    if (((console::g_initialized ^ 0xff) & 1) != 0) {
      console::initialize();
    }
    LVar5 = (Level)((ulong)in_stack_fffffffffffffec0 >> 0x20);
    if (((update::loc.initialized_ ^ 0xffU) & 1) != 0) {
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_51;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
                 (allocator<char> *)in_stack_fffffffffffffed0);
      console::initializeLogLocation
                (in_stack_fffffffffffffed0,
                 (string *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),LVar5);
      std::__cxx11::string::~string((string *)(local_51 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_51);
    }
    if (update::loc.level_ != Error) {
      console::setLogLocationLevel
                ((LogLocation *)in_stack_fffffffffffffea0,
                 (Level)((ulong)in_stack_fffffffffffffe98 >> 0x20));
      console::checkLogLocationEnabled((LogLocation *)in_stack_fffffffffffffeb0._M_current);
    }
    local_52 = (update::loc.logger_enabled_ & 1U) != 0;
    if ((bool)local_52) {
      logger_handle = update::loc.logger_;
      LVar5 = update::loc.level_;
      in_stack_fffffffffffffea0 = (function<void_(int)> *)last_socket_error_string();
      in_stack_fffffffffffffe98 = "poll failed with error %s";
      console::print((FilterBase *)0x0,logger_handle,(Level)(ulong)LVar5,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/poll_set.cpp"
                     ,0xc3,"void miniros::PollSet::update(int)");
    }
  }
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_fffffffffffffea0,
             (mutex_type *)in_stack_fffffffffffffe98);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x4857af);
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4857b9);
  std::shared_ptr<std::vector<pollfd,_std::allocator<pollfd>_>_>::~shared_ptr
            ((shared_ptr<std::vector<pollfd,_std::allocator<pollfd>_>_> *)0x4857c6);
  return;
}

Assistant:

void PollSet::update(int poll_timeout)
{
  createNativePollset();

  // Poll across the sockets we're servicing
  std::shared_ptr<std::vector<socket_pollfd> > ofds = poll_sockets(epfd_, &ufds_.front(), ufds_.size(), poll_timeout);
  if (!ofds)
  {
    MINIROS_ERROR("poll failed with error %s", last_socket_error_string());
  }
  else
  {
    for (std::vector<socket_pollfd>::iterator it = ofds->begin() ; it != ofds->end(); ++it)
    {
      int fd = it->fd;
      int revents = it->revents;
      SocketUpdateFunc func;
      TransportPtr transport;
      int events = 0;

      if (revents == 0)
      {
        continue;
      }
      {
        std::scoped_lock<std::mutex> lock(socket_info_mutex_);
        M_SocketInfo::iterator it = socket_info_.find(fd);
        // the socket has been entirely deleted
        if (it == socket_info_.end())
        {
          continue;
        }

        const SocketInfo& info = it->second;

        // Store off the function and transport in case the socket is deleted from another thread
        func = info.func_;
        transport = info.transport_;
        events = info.events_;
      }

      // If these are registered events for this socket, OR the events are ERR/HUP/NVAL,
      // call through to the registered function
      if (func
          && ((events & revents)
              || (revents & POLLERR)
              || (revents & POLLHUP)
              || (revents & POLLNVAL)))
      {
        bool skip = false;
        if (revents & (POLLNVAL|POLLERR|POLLHUP))
        {
          // If a socket was just closed and then the file descriptor immediately reused, we can
          // get in here with what we think is a valid socket (since it was just re-added to our set)
          // but which is actually referring to the previous fd with the same #.  If this is the case,
          // we ignore the first instance of one of these errors.  If it's a real error we'll
          // hit it again next time through.
          std::scoped_lock<std::mutex> lock(just_deleted_mutex_);
          if (std::find(just_deleted_.begin(), just_deleted_.end(), fd) != just_deleted_.end())
          {
            skip = true;
          }
        }

        if (!skip)
        {
          func(revents & (events|POLLERR|POLLHUP|POLLNVAL));
        }
      }
    }
  }

  std::scoped_lock<std::mutex> lock(just_deleted_mutex_);
  just_deleted_.clear();

}